

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall re2::Compiler::Cat(Compiler *this,Frag a,Frag b)

{
  PatchList l;
  PatchList end;
  PatchList l_00;
  bool bVar1;
  InstOp IVar2;
  int iVar3;
  Inst *pIVar4;
  Frag FVar5;
  byte local_b1;
  byte local_a9;
  Inst *begin;
  uint32_t local_68;
  bool bStack_64;
  Compiler *this_local;
  Frag b_local;
  Frag a_local;
  uint32_t local_10;
  undefined4 uStack_c;
  
  b_local.end.tail = a.begin;
  b_local._12_4_ = a.end.head;
  a_local.begin = a.end.tail;
  a_local.end.head = a._12_4_;
  this_local._0_4_ = b.begin;
  bVar1 = IsNoMatch(a);
  if (!bVar1) {
    bVar1 = IsNoMatch(b);
    if (!bVar1) {
      pIVar4 = PODArray<re2::Prog::Inst>::operator[](&this->inst_,b_local.end.tail);
      IVar2 = Prog::Inst::opcode(pIVar4);
      if ((IVar2 == kInstNop) && (b_local._12_4_ == b_local.end.tail * 2)) {
        iVar3 = Prog::Inst::out(pIVar4);
        if (iVar3 == 0) {
          pIVar4 = PODArray<re2::Prog::Inst>::data(&this->inst_);
          l.tail = a_local.begin;
          l.head = b_local._12_4_;
          PatchList::Patch(pIVar4,l,(uint32_t)this_local);
          local_10 = b.end.tail;
          uStack_c = b._12_4_;
          a_local._8_8_ = b._0_8_;
          goto LAB_00356843;
        }
      }
      b_local.end.head._0_1_ = b.nullable;
      if ((this->reversed_ & 1U) == 0) {
        pIVar4 = PODArray<re2::Prog::Inst>::data(&this->inst_);
        l_00.tail = a_local.begin;
        l_00.head = b_local._12_4_;
        PatchList::Patch(pIVar4,l_00,(uint32_t)this_local);
        local_b1 = 0;
        if ((a_local.end.head & 1) != 0) {
          local_b1 = b_local.end.head._0_1_;
        }
        Frag::Frag((Frag *)&a_local.end.tail,b_local.end.tail,b.end,(bool)(local_b1 & 1));
      }
      else {
        pIVar4 = PODArray<re2::Prog::Inst>::data(&this->inst_);
        PatchList::Patch(pIVar4,b.end,b_local.end.tail);
        end.tail = a_local.begin;
        end.head = b_local._12_4_;
        local_a9 = 0;
        if (((undefined1  [16])b & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          local_a9 = (byte)a_local.end.head;
        }
        Frag::Frag((Frag *)&a_local.end.tail,(uint32_t)this_local,end,(bool)(local_a9 & 1));
      }
      goto LAB_00356843;
    }
  }
  FVar5 = NoMatch(this);
  begin = FVar5._0_8_;
  a_local._8_8_ = begin;
  local_68 = FVar5.end.tail;
  local_10 = local_68;
  bStack_64 = FVar5.nullable;
  uStack_c = CONCAT31(uStack_c._1_3_,bStack_64);
LAB_00356843:
  FVar5.end.tail = local_10;
  FVar5._0_8_ = a_local._8_8_;
  FVar5._12_4_ = uStack_c;
  return FVar5;
}

Assistant:

Frag Compiler::Cat(Frag a, Frag b) {
  if (IsNoMatch(a) || IsNoMatch(b))
    return NoMatch();

  // Elide no-op.
  Prog::Inst* begin = &inst_[a.begin];
  if (begin->opcode() == kInstNop &&
      a.end.head == (a.begin << 1) &&
      begin->out() == 0) {
    // in case refs to a somewhere
    PatchList::Patch(inst_.data(), a.end, b.begin);
    return b;
  }

  // To run backward over string, reverse all concatenations.
  if (reversed_) {
    PatchList::Patch(inst_.data(), b.end, a.begin);
    return Frag(b.begin, a.end, b.nullable && a.nullable);
  }

  PatchList::Patch(inst_.data(), a.end, b.begin);
  return Frag(a.begin, b.end, a.nullable && b.nullable);
}